

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O2

int vfio_disable_msix(int device_fd)

{
  int iVar1;
  int *piVar2;
  char irq_set_buf [152];
  char buf [512];
  undefined1 local_218 [520];
  
  fprintf(_stdout,"[INFO ] %s:%d %s(): Disable MSIX Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x81,
          "vfio_disable_msix");
  iVar1 = ioctl(device_fd,0x3b6e);
  if (iVar1 != -1) {
    return 0;
  }
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  __xpg_strerror_r(iVar1,local_218,0x200);
  fprintf(_stderr,"[ERROR] %s:%d %s(): Failed to %s: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x8c,
          "vfio_disable_msix","disable MSIX interrupt",local_218);
  exit(iVar1);
}

Assistant:

int vfio_disable_msix(int device_fd) {
	info("Disable MSIX Interrupts");
	struct vfio_irq_set* irq_set;
	char irq_set_buf[MSIX_IRQ_SET_BUF_LEN];

	irq_set = (struct vfio_irq_set*) irq_set_buf;
	irq_set->argsz = sizeof(struct vfio_irq_set);
	irq_set->count = 0;
	irq_set->flags = VFIO_IRQ_SET_DATA_NONE | VFIO_IRQ_SET_ACTION_TRIGGER;
	irq_set->index = VFIO_PCI_MSIX_IRQ_INDEX;
	irq_set->start = 0;

	check_err(ioctl(device_fd, VFIO_DEVICE_SET_IRQS, irq_set), "disable MSIX interrupt");

	return 0;
}